

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O0

nsync_dll_list_ nsync_dll_remove_(nsync_dll_list_ list,nsync_dll_element_ *e)

{
  nsync_dll_element_ *e_local;
  nsync_dll_list_ list_local;
  
  e_local = list;
  if (list == e) {
    if (list->prev == list) {
      e_local = (nsync_dll_element_ *)0x0;
    }
    else {
      e_local = list->prev;
    }
  }
  e->next->prev = e->prev;
  e->prev->next = e->next;
  e->next = e;
  e->prev = e;
  return e_local;
}

Assistant:

nsync_dll_list_ nsync_dll_remove_ (nsync_dll_list_ list, nsync_dll_element_ *e) {
	if (list == e) { /* removing tail of list */
		if (list->prev == list) {
			list = NULL; /* removing only element of list */
		} else {
			list = list->prev;
		}
	}
	e->next->prev = e->prev;
	e->prev->next = e->next;
	e->next = e;
	e->prev = e;
	return (list);
}